

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O3

bool __thiscall toml::internal::Parser::parseArray(Parser *this,Value *v)

{
  TokenType TVar1;
  bool bVar2;
  Value x;
  Array a;
  string local_68;
  Value local_48;
  vector<toml::Value,_std::allocator<toml::Value>_> local_38;
  
  if ((this->token_).type_ != LBRACKET) {
    return false;
  }
  nextValue(this);
  local_38.super__Vector_base<toml::Value,_std::allocator<toml::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<toml::Value,_std::allocator<toml::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<toml::Value,_std::allocator<toml::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    while (TVar1 = (this->token_).type_, TVar1 == END_OF_LINE) {
      nextValue(this);
    }
    if (TVar1 == RBRACKET) goto LAB_0015b597;
    local_48.type_ = NULL_TYPE;
    local_48.field_1.null_ = (void *)0x0;
    bVar2 = parseValue(this,&local_48);
    if (!bVar2) break;
    if ((local_38.super__Vector_base<toml::Value,_std::allocator<toml::Value>_>._M_impl.
         super__Vector_impl_data._M_start !=
         local_38.super__Vector_base<toml::Value,_std::allocator<toml::Value>_>._M_impl.
         super__Vector_impl_data._M_finish) &&
       ((local_38.super__Vector_base<toml::Value,_std::allocator<toml::Value>_>._M_impl.
         super__Vector_impl_data._M_start)->type_ != local_48.type_)) {
      local_68._M_dataplus._M_p = (pointer)((long)&local_68 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"type check failed","");
      addError(this,&local_68);
      if (local_68._M_dataplus._M_p != (pointer)((long)&local_68 + 0x10)) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      break;
    }
    std::vector<toml::Value,_std::allocator<toml::Value>_>::emplace_back<toml::Value>
              (&local_38,&local_48);
    while (TVar1 = (this->token_).type_, TVar1 == END_OF_LINE) {
      nextValue(this);
    }
    if (TVar1 == COMMA) {
      nextValue(this);
    }
    else if (TVar1 == RBRACKET) {
      Value::~Value(&local_48);
      if ((this->token_).type_ == RBRACKET) {
LAB_0015b597:
        nextValue(this);
        local_68._M_dataplus._M_p._0_4_ = 6;
        local_68._M_string_length = (size_type)operator_new(0x18);
        (((Array *)local_68._M_string_length)->
        super__Vector_base<toml::Value,_std::allocator<toml::Value>_>)._M_impl.
        super__Vector_impl_data._M_start =
             local_38.super__Vector_base<toml::Value,_std::allocator<toml::Value>_>._M_impl.
             super__Vector_impl_data._M_start;
        (((Array *)local_68._M_string_length)->
        super__Vector_base<toml::Value,_std::allocator<toml::Value>_>)._M_impl.
        super__Vector_impl_data._M_finish =
             local_38.super__Vector_base<toml::Value,_std::allocator<toml::Value>_>._M_impl.
             super__Vector_impl_data._M_finish;
        (((Array *)local_68._M_string_length)->
        super__Vector_base<toml::Value,_std::allocator<toml::Value>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_38.super__Vector_base<toml::Value,_std::allocator<toml::Value>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_38.super__Vector_base<toml::Value,_std::allocator<toml::Value>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_38.super__Vector_base<toml::Value,_std::allocator<toml::Value>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_38.super__Vector_base<toml::Value,_std::allocator<toml::Value>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if ((Value *)&local_68 != v) {
          Value::~Value(v);
          v->type_ = (Type)local_68._M_dataplus._M_p;
          switch((ulong)local_68._M_dataplus._M_p & 0xffffffff) {
          case 0:
          case 2:
          case 4:
          case 5:
          case 6:
          case 7:
            (v->field_1).array_ = (Array *)local_68._M_string_length;
            break;
          case 1:
            (v->field_1).bool_ = (bool)(undefined1)local_68._M_string_length;
            break;
          case 3:
            (v->field_1).array_ = (Array *)local_68._M_string_length;
            break;
          default:
            v->type_ = NULL_TYPE;
            (v->field_1).null_ = (void *)0x0;
          }
          local_68._M_dataplus._M_p = local_68._M_dataplus._M_p & 0xffffffff00000000;
          local_68._M_string_length = 0;
        }
        Value::~Value((Value *)&local_68);
        bVar2 = true;
      }
      else {
LAB_0015b57f:
        bVar2 = false;
      }
      std::vector<toml::Value,_std::allocator<toml::Value>_>::~vector(&local_38);
      return bVar2;
    }
    Value::~Value(&local_48);
  }
  Value::~Value(&local_48);
  goto LAB_0015b57f;
}

Assistant:

inline bool Parser::consumeForValue(TokenType type)
{
    if (token().type() == type) {
        nextValue();
        return true;
    }

    return false;
}